

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O0

bool __thiscall
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
::Binary_(ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
          *this)

{
  bool bVar1;
  char *pcVar2;
  bool local_21;
  ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
  *this_local;
  
  bVar1 = Position::has_more(&this->m_position);
  if ((bVar1) && (pcVar2 = Position::operator*(&this->m_position), *pcVar2 == '0')) {
    Position::operator++(&this->m_position);
    bVar1 = Position::has_more(&this->m_position);
    if (bVar1) {
      pcVar2 = Position::operator*(&this->m_position);
      bVar1 = char_in_alphabet(this,*pcVar2,b_alphabet);
      if (bVar1) {
        Position::operator++(&this->m_position);
        bVar1 = Position::has_more(&this->m_position);
        if (bVar1) {
          pcVar2 = Position::operator*(&this->m_position);
          bVar1 = char_in_alphabet(this,*pcVar2,bin_alphabet);
          if (bVar1) {
            while( true ) {
              bVar1 = Position::has_more(&this->m_position);
              local_21 = false;
              if (bVar1) {
                pcVar2 = Position::operator*(&this->m_position);
                local_21 = char_in_alphabet(this,*pcVar2,bin_alphabet);
              }
              if (local_21 == false) break;
              Position::operator++(&this->m_position);
            }
            return true;
          }
        }
        Position::operator--(&this->m_position);
        return false;
      }
    }
    Position::operator--(&this->m_position);
  }
  return false;
}

Assistant:

bool Binary_() {
        if (m_position.has_more() && (*m_position == '0')) {
          ++m_position;

          if (m_position.has_more() && char_in_alphabet(*m_position, detail::b_alphabet)) {
            ++m_position;
            if (m_position.has_more() && char_in_alphabet(*m_position, detail::bin_alphabet)) {
              while (m_position.has_more() && char_in_alphabet(*m_position, detail::bin_alphabet)) {
                ++m_position;
              }
              return true;
            } else {
              --m_position;
            }
          } else {
            --m_position;
          }
        }

        return false;
      }